

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_RaiseSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *pAVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  char *pcVar8;
  AActor *raiser;
  bool bVar9;
  TThinkerIterator<AActor> it;
  FThinkerIterator local_40;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar1 = (AActor *)(param->field_0).field_1.a;
      if (pAVar1 != (AActor *)0x0) {
        if ((pAVar1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(pAVar1->super_DThinker).super_DObject._vptr_DObject)(pAVar1);
          (pAVar1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (pAVar1->super_DThinker).super_DObject.Class;
        bVar9 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar9) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d84fe;
        }
      }
      if (numparam == 1) {
        param = defaultparam->Array;
        if (param[1].field_0.field_3.Type == '\0') {
LAB_003d8405:
          iVar3 = param[1].field_0.i;
          FThinkerIterator::FThinkerIterator(&local_40,AActor::RegistrationInfo.MyClass,0x80);
          pAVar5 = (pAVar1->master).field_0.p;
          if (pAVar5 != (AActor *)0x0) {
            if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
              pAVar5 = (AActor *)FThinkerIterator::Next(&local_40,false);
              if (pAVar5 != (AActor *)0x0) {
                raiser = pAVar1;
                if (iVar3 == 0) {
                  raiser = (AActor *)0x0;
                }
                do {
                  pAVar6 = (pAVar1->master).field_0.p;
                  if ((pAVar6 != (AActor *)0x0) &&
                     (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (pAVar1->master).field_0.p = (AActor *)0x0;
                    pAVar6 = (AActor *)0x0;
                  }
                  pAVar7 = (pAVar5->master).field_0.p;
                  if ((pAVar7 != (AActor *)0x0) &&
                     (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (pAVar5->master).field_0.p = (AActor *)0x0;
                    pAVar7 = (AActor *)0x0;
                  }
                  if (pAVar5 != pAVar1 && pAVar7 == pAVar6) {
                    P_Thing_Raise(pAVar5,raiser);
                  }
                  pAVar5 = (AActor *)FThinkerIterator::Next(&local_40,false);
                } while (pAVar5 != (AActor *)0x0);
              }
            }
            else {
              (pAVar1->master).field_0.p = (AActor *)0x0;
            }
          }
          return 0;
        }
        pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') goto LAB_003d8405;
        pcVar8 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x121f,
                    "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d84fe:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x121e,
                "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ((mo = it.Next()) != NULL)
		{
			if (mo->master == self->master && mo != self)
			{
				P_Thing_Raise(mo, copy ? self : NULL);
			}
		}
	}
	return 0;
}